

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

int ImGui::DataTypeCompare(ImGuiDataType data_type,void *arg_1,void *arg_2)

{
  void *arg_2_local;
  void *arg_1_local;
  ImGuiDataType data_type_local;
  
  switch(data_type) {
  case 0:
    arg_1_local._4_4_ = DataTypeCompareT<signed_char>((char *)arg_1,(char *)arg_2);
    break;
  case 1:
    arg_1_local._4_4_ = DataTypeCompareT<unsigned_char>((uchar *)arg_1,(uchar *)arg_2);
    break;
  case 2:
    arg_1_local._4_4_ = DataTypeCompareT<short>((short *)arg_1,(short *)arg_2);
    break;
  case 3:
    arg_1_local._4_4_ =
         DataTypeCompareT<unsigned_short>((unsigned_short *)arg_1,(unsigned_short *)arg_2);
    break;
  case 4:
    arg_1_local._4_4_ = DataTypeCompareT<int>((int *)arg_1,(int *)arg_2);
    break;
  case 5:
    arg_1_local._4_4_ = DataTypeCompareT<unsigned_int>((uint *)arg_1,(uint *)arg_2);
    break;
  case 6:
    arg_1_local._4_4_ = DataTypeCompareT<long_long>((longlong *)arg_1,(longlong *)arg_2);
    break;
  case 7:
    arg_1_local._4_4_ =
         DataTypeCompareT<unsigned_long_long>
                   ((unsigned_long_long *)arg_1,(unsigned_long_long *)arg_2);
    break;
  case 8:
    arg_1_local._4_4_ = DataTypeCompareT<float>((float *)arg_1,(float *)arg_2);
    break;
  case 9:
    arg_1_local._4_4_ = DataTypeCompareT<double>((double *)arg_1,(double *)arg_2);
    break;
  case 10:
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_widgets.cpp"
                  ,0x7fc,"int ImGui::DataTypeCompare(ImGuiDataType, const void *, const void *)");
  }
  return arg_1_local._4_4_;
}

Assistant:

int ImGui::DataTypeCompare(ImGuiDataType data_type, const void* arg_1, const void* arg_2)
{
    switch (data_type)
    {
    case ImGuiDataType_S8:     return DataTypeCompareT<ImS8  >((const ImS8*  )arg_1, (const ImS8*  )arg_2);
    case ImGuiDataType_U8:     return DataTypeCompareT<ImU8  >((const ImU8*  )arg_1, (const ImU8*  )arg_2);
    case ImGuiDataType_S16:    return DataTypeCompareT<ImS16 >((const ImS16* )arg_1, (const ImS16* )arg_2);
    case ImGuiDataType_U16:    return DataTypeCompareT<ImU16 >((const ImU16* )arg_1, (const ImU16* )arg_2);
    case ImGuiDataType_S32:    return DataTypeCompareT<ImS32 >((const ImS32* )arg_1, (const ImS32* )arg_2);
    case ImGuiDataType_U32:    return DataTypeCompareT<ImU32 >((const ImU32* )arg_1, (const ImU32* )arg_2);
    case ImGuiDataType_S64:    return DataTypeCompareT<ImS64 >((const ImS64* )arg_1, (const ImS64* )arg_2);
    case ImGuiDataType_U64:    return DataTypeCompareT<ImU64 >((const ImU64* )arg_1, (const ImU64* )arg_2);
    case ImGuiDataType_Float:  return DataTypeCompareT<float >((const float* )arg_1, (const float* )arg_2);
    case ImGuiDataType_Double: return DataTypeCompareT<double>((const double*)arg_1, (const double*)arg_2);
    case ImGuiDataType_COUNT:  break;
    }
    IM_ASSERT(0);
    return 0;
}